

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void * rw::textureClose(void *object,int32 offset,int32 size)

{
  LLLink *pLVar1;
  Texture *pTVar2;
  LLLink *pLVar3;
  TexDictionary *this;
  Texture *pTVar4;
  Texture *tex;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  _next_1 = *(LLLink **)(engine + 0x20 + (long)textureModuleOffset);
  while( true ) {
    pLVar1 = _next_1->next;
    pLVar3 = LinkList::end((LinkList *)(engine + textureModuleOffset + 0x20));
    if (_next_1 == pLVar3) break;
    this = TexDictionary::fromLink(_next_1);
    TexDictionary::destroy(this);
    _next_1 = pLVar1;
  }
  *(undefined8 *)(engine + textureModuleOffset) = 0;
  *(undefined8 *)(engine + 8 + (long)textureModuleOffset) = 0;
  tex = *(Texture **)(engine + 0x30 + (long)textureModuleOffset);
  while( true ) {
    pTVar2 = (Texture *)tex->raster;
    pTVar4 = (Texture *)LinkList::end((LinkList *)(engine + textureModuleOffset + 0x30));
    if (tex == pTVar4) break;
    printf("Tex still allocated: %d %s %s\n",(ulong)*(uint *)((long)&tex[-1].inGlobalList.prev + 4),
           tex[-1].name + 0x10,tex[-1].mask + 0x10);
    Texture::destroy((Texture *)&tex[-1].inDict);
    tex = pTVar2;
  }
  return object;
}

Assistant:

static void*
textureClose(void *object, int32 offset, int32 size)
{
	FORLIST(lnk, TEXTUREGLOBAL(texDicts))
		TexDictionary::fromLink(lnk)->destroy();
	TEXTUREGLOBAL(initialTexDict) = nil;
	TEXTUREGLOBAL(currentTexDict) = nil;

	FORLIST(lnk, TEXTUREGLOBAL(textures)){
		Texture *tex = LLLinkGetData(lnk, Texture, inGlobalList);
		printf("Tex still allocated: %d %s %s\n", tex->refCount, tex->name, tex->mask);
		assert(tex->dict == nil);
		tex->destroy();
	}
	return object;
}